

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpke.cc
# Opt level: O1

int EVP_HPKE_KEY_private_key(EVP_HPKE_KEY *key,uint8_t *out,size_t *out_len,size_t max_out)

{
  ulong __n;
  int iVar1;
  
  __n = key->kem->private_key_len;
  if (max_out < __n) {
    iVar1 = 0;
    ERR_put_error(6,0,0x89,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hpke/hpke.cc"
                  ,0x2b8);
  }
  else {
    if (__n != 0) {
      memcpy(out,key->private_key,__n);
    }
    *out_len = key->kem->private_key_len;
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int EVP_HPKE_KEY_private_key(const EVP_HPKE_KEY *key, uint8_t *out,
                             size_t *out_len, size_t max_out) {
  if (max_out < key->kem->private_key_len) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_INVALID_BUFFER_SIZE);
    return 0;
  }
  OPENSSL_memcpy(out, key->private_key, key->kem->private_key_len);
  *out_len = key->kem->private_key_len;
  return 1;
}